

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_mul_exp(SyntaxAnalyze *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pWVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  OperationType OVar6;
  ExpressNode *this_01;
  ulong uVar7;
  int iVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Op op;
  SyntaxAnalyze *in_RSI;
  SharedExNdPtr SVar9;
  string tmpName;
  SharedExNdPtr father;
  undefined1 local_f8 [40];
  ExpressNode *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  SharedExNdPtr local_c0;
  SharedExNdPtr local_b0;
  SharedExNdPtr local_a0;
  SharedExNdPtr local_90;
  string local_80;
  irGenerator *local_60;
  _Base_ptr local_58;
  string local_50;
  
  *(undefined8 *)this = 0;
  this->matched_index = 0;
  gm_unary_exp((SyntaxAnalyze *)local_f8);
  uVar4 = local_f8._8_8_;
  uVar3 = local_f8._0_8_;
  local_f8._0_8_ = (element_type *)0x0;
  local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
  *(undefined8 *)this = uVar3;
  this->matched_index = uVar4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  local_58 = (_Base_ptr)&this->matched_index;
  local_60 = &in_RSI->irGenerator;
  do {
    bVar5 = try_word(in_RSI,1,MULT,DIV,MOD);
    if (!bVar5) {
      SVar9.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      SVar9.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (SharedExNdPtr)
             SVar9.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
    }
    this_01 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(this_01);
    local_d0 = this_01;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
              (&local_c8,this_01);
    uVar7 = in_RSI->matched_index + 1;
    pWVar1 = (in_RSI->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((uVar7 < (ulong)(((long)(in_RSI->word_list->
                                super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                        -0x5555555555555555)) &&
       (bVar5 = word::Word::match_token(pWVar1 + uVar7,MULT), bVar5)) {
      match_one_word(in_RSI,MULT);
      op = Mul;
      OVar6 = MUL;
    }
    else {
      uVar7 = in_RSI->matched_index + 1;
      pWVar1 = (in_RSI->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((uVar7 < (ulong)(((long)(in_RSI->word_list->
                                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                          -0x5555555555555555)) &&
         (bVar5 = word::Word::match_token(pWVar1 + uVar7,DIV), bVar5)) {
        match_one_word(in_RSI,DIV);
        op = Div;
        OVar6 = DIV;
      }
      else {
        match_one_word(in_RSI,MOD);
        op = Rem;
        OVar6 = MOD;
      }
    }
    local_d0->_operation = OVar6;
    gm_unary_exp((SyntaxAnalyze *)local_f8);
    uVar4 = local_f8._8_8_;
    uVar3 = local_f8._0_8_;
    local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f8._0_8_ = (element_type *)0x0;
    piVar2 = *(int **)this;
    if ((*piVar2 == 0) && (*(NodeType *)uVar3 == CNS)) {
      local_d0->_type = CNS;
      OVar6 = local_d0->_operation;
      if (OVar6 == MUL) {
        iVar8 = *(int *)(uVar3 + 8) * piVar2[2];
LAB_001a52ae:
        local_d0->_value = iVar8;
      }
      else if (OVar6 == DIV) {
        local_d0->_value = piVar2[2] / *(int *)(uVar3 + 8);
      }
      else if (OVar6 == MOD) {
        iVar8 = piVar2[2] % *(int *)(uVar3 + 8);
        goto LAB_001a52ae;
      }
    }
    else {
      local_f8._0_8_ = local_f8 + 0x10;
      local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_f8[0x10] = 0;
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_50,local_60,Int);
      std::__cxx11::string::operator=((string *)local_f8,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_d0->_type = VAR;
      std::__cxx11::string::_M_assign((string *)&local_d0->_name);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_f8._0_8_,
                 (undefined1 *)
                 ((long)(NodeType *)local_f8._0_8_ + (long)(_func_int ***)local_f8._8_8_));
      local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)this;
      local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
      if ((element_type *)
          local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_90.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_name)._M_dataplus._M_p =
               *(int *)&(((element_type *)
                         local_90.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_name)._M_dataplus._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_90.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_name)._M_dataplus._M_p =
               *(int *)&(((element_type *)
                         local_90.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_name)._M_dataplus._M_p + 1;
        }
      }
      local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar3;
      local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
        }
      }
      hp_gn_binary_mir(in_RSI,&local_80,&local_90,&local_a0,op);
      if (local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((element_type *)
          local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((element_type *)local_f8._0_8_ != (element_type *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
      }
    }
    local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)this;
    local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
    if (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    express::ExpressNode::addChild(local_d0,&local_b0);
    if (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(uVar4 + 8) = *(_Atomic_word *)(uVar4 + 8) + 1;
      }
    }
    express::ExpressNode::addChild(local_d0,&local_c0);
    if (local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    *(ExpressNode **)this = local_d0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_58,&local_c8);
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    }
  } while( true );
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_mul_exp() {
  SharedExNdPtr first;
  first = gm_unary_exp();

  while (try_word(1, Token::MULT, Token::DIV, Token::MOD)) {
    SharedExNdPtr second;
    SharedExNdPtr father(new ExpressNode());
    Op op;

    if (try_word(1, Token::MULT)) {
      match_one_word(Token::MULT);
      father->_operation = OperationType::MUL;
      op = Op::Mul;
    } else if (try_word(1, Token::DIV)) {
      match_one_word(Token::DIV);
      father->_operation = OperationType::DIV;
      op = Op::Div;
    } else {
      match_one_word(Token::MOD);
      father->_operation = OperationType::MOD;
      op = Op::Rem;
    }

    second = gm_unary_exp();

    if (first->_type == NodeType::CNS && second->_type == NodeType::CNS) {
      father->_type = NodeType::CNS;
      switch (father->_operation) {
        case OperationType::MUL:
          father->_value = first->_value * second->_value;
          break;
        case OperationType::DIV:
          father->_value = first->_value / second->_value;
          break;
        case OperationType::MOD:
          father->_value = first->_value % second->_value;
          break;
        default:
          break;
      }
    } else {
      string tmpName;

      tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      father->_type = NodeType::VAR;
      father->_name = tmpName;

      hp_gn_binary_mir(tmpName, first, second, op);
    }
    father->addChild(first);
    father->addChild(second);
    first = father;
  }
  return first;
}